

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O0

Pass * wasm::createReorderGlobalsPass(void)

{
  ReorderGlobals *this;
  
  this = (ReorderGlobals *)operator_new(0x38);
  ReorderGlobals::ReorderGlobals(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createReorderGlobalsPass() { return new ReorderGlobals(false); }